

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RWBBlock.h
# Opt level: O1

pair<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>
 __thiscall dg::dda::RWBBlock::splitAround(RWBBlock *this,NodeT *node)

{
  pointer *this_00;
  NodesT *pNVar1;
  size_t *psVar2;
  RWSubgraph *pRVar3;
  long *plVar4;
  long *plVar5;
  pointer ppRVar6;
  pointer ppRVar7;
  pointer ppRVar8;
  pointer ppRVar9;
  pointer ppRVar10;
  RWNode *pRVar11;
  RWBBlock *s;
  _List_node_base *p_Var12;
  RWBBlock *s_00;
  _List_node_base *p_Var13;
  RWBBlock *pRVar14;
  long *plVar15;
  uint uVar16;
  _Head_base<0UL,_dg::dda::RWBBlock_*,_false> in_RDX;
  _Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_> extraout_RDX;
  RWBBlock *extraout_RDX_00;
  size_type __new_size;
  long *plVar17;
  ElemWithEdges<dg::dda::RWBBlock> *this_01;
  _func_int **pp_Var18;
  pair<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>
  pVar19;
  
  if ((node->super_SubgraphNode<dg::dda::RWNode>)._predecessors.
      super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish == (pointer)0x1) {
    *(undefined8 *)
     &(this->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
      super_CFGElement<dg::dda::RWBBlock> = 0;
    (this->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>
    .super_ElemWithEdges<dg::dda::RWBBlock>._successors.
    super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    goto LAB_0010ee0a;
  }
  this_00 = &(node->super_SubgraphNode<dg::dda::RWNode>)._successors.
             super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  uVar16 = 0;
  for (pRVar11 = (RWNode *)*this_00;
      (pRVar11 != (RWNode *)this_00 &&
      ((_Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>)
       *(tuple<dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_> *)
        ((long)&pRVar11->super_SubgraphNode<dg::dda::RWNode> + 8) !=
       (_Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>)
       in_RDX._M_head_impl)); pRVar11 = (RWNode *)pRVar11->_vptr_RWNode) {
    uVar16 = uVar16 + 1;
  }
  pp_Var18 = pRVar11->_vptr_RWNode;
  if ((pointer *)pp_Var18 == this_00) {
    s = (RWBBlock *)0x0;
  }
  else {
    s = (RWBBlock *)operator_new(0x58);
    pRVar3 = (RWSubgraph *)
             (node->super_SubgraphNode<dg::dda::RWNode>)._predecessors.
             super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    ElemId::idcnt._0_4_ = (int)ElemId::idcnt + 1;
    (s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>.
    super_ElemId.id = (int)ElemId::idcnt;
    (s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>.
    super_ElemWithEdges<dg::dda::RWBBlock>._successors.
    super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)&(s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
             super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>._successors.
             super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
             super__Vector_impl_data + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
             super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>._successors.
             super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
             super__Vector_impl_data + 0x10) = (pointer)0x0;
    (s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>.
    super_ElemWithEdges<dg::dda::RWBBlock>._predecessors.
    super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)&(s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
             super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
             _predecessors.
             super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
             super__Vector_impl_data + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
             super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
             _predecessors.
             super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
             super__Vector_impl_data + 0x10) = (pointer)0x0;
    pNVar1 = &(s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes;
    (s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
    super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)pNVar1;
    (s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
    super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)pNVar1;
    (s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
    super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl._M_node._M_size
         = 0;
    s->subgraph = pRVar3;
    do {
      p_Var13 = (_List_node_base *)pp_Var18[2];
      p_Var12 = (_List_node_base *)operator_new(0x18);
      p_Var12[1]._M_next = p_Var13;
      std::__detail::_List_node_base::_M_hook(p_Var12);
      psVar2 = &(s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
                super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                _M_node._M_size;
      *psVar2 = *psVar2 + 1;
      p_Var13[9]._M_prev = (_List_node_base *)s;
      pp_Var18 = (_func_int **)*pp_Var18;
    } while ((pointer *)pp_Var18 != this_00);
  }
  if (uVar16 == 0) {
    __new_size = 1;
    s_00 = (RWBBlock *)0x0;
  }
  else {
    s_00 = (RWBBlock *)operator_new(0x58);
    pRVar3 = (RWSubgraph *)
             (node->super_SubgraphNode<dg::dda::RWNode>)._predecessors.
             super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    ElemId::idcnt._0_4_ = (int)ElemId::idcnt + 1;
    (s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>
    .super_ElemId.id = (int)ElemId::idcnt;
    (s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>
    .super_ElemWithEdges<dg::dda::RWBBlock>._successors.
    super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)&(s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
             super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>._successors.
             super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
             super__Vector_impl_data + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
             super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>._successors.
             super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
             super__Vector_impl_data + 0x10) = (pointer)0x0;
    (s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>
    .super_ElemWithEdges<dg::dda::RWBBlock>._predecessors.
    super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)&(s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
             super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
             _predecessors.
             super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
             super__Vector_impl_data + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
             super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
             _predecessors.
             super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
             super__Vector_impl_data + 0x10) = (pointer)0x0;
    pNVar1 = &(s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes;
    (s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
    super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)pNVar1;
    (s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
    super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)pNVar1;
    (s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
    super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl._M_node._M_size
         = 0;
    s_00->subgraph = pRVar3;
    p_Var13 = (_List_node_base *)operator_new(0x18);
    p_Var13[1]._M_next = (_List_node_base *)in_RDX._M_head_impl;
    std::__detail::_List_node_base::_M_hook(p_Var13);
    psVar2 = &(s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
              super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
              _M_node._M_size;
    *psVar2 = *psVar2 + 1;
    *(RWBBlock **)((long)in_RDX._M_head_impl + 0x98) = s_00;
    __new_size = (size_type)uVar16;
  }
  std::__cxx11::list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::resize
            ((list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)this_00,__new_size);
  pRVar14 = s;
  if (s == (RWBBlock *)0x0) {
    pRVar14 = s_00;
  }
  plVar4 = (long *)(node->super_SubgraphNode<dg::dda::RWNode>).data;
  for (plVar15 = *(long **)&node->super_SubgraphNode<dg::dda::RWNode>; plVar15 != plVar4;
      plVar15 = plVar15 + 1) {
    plVar5 = *(long **)(*plVar15 + 0x28);
    for (plVar17 = *(long **)(*plVar15 + 0x20); plVar17 != plVar5; plVar17 = plVar17 + 1) {
      if ((NodeT *)*plVar17 == node) {
        *plVar17 = (long)pRVar14;
      }
    }
  }
  this_01 = (ElemWithEdges<dg::dda::RWBBlock> *)&node->super_SubgraphNode<dg::dda::RWNode>;
  ppRVar6 = *(pointer *)
             ((long)&(pRVar14->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                     super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                     _successors.
                     super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                     _M_impl.super__Vector_impl_data + 0x10);
  ppRVar7 = *(pointer *)&node->super_SubgraphNode<dg::dda::RWNode>;
  ppRVar8 = (pointer)(node->super_SubgraphNode<dg::dda::RWNode>).data;
  *(void **)((long)&(pRVar14->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                    super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                    _successors.
                    super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                    _M_impl.super__Vector_impl_data + 0x10) =
       (node->super_SubgraphNode<dg::dda::RWNode>).user_data;
  ppRVar9 = (pRVar14->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
            super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>._successors.
            super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppRVar10 = *(pointer *)
              ((long)&(pRVar14->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                      super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                      _successors.
                      super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                      _M_impl.super__Vector_impl_data + 8);
  (pRVar14->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
  super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>._successors.
  super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
  super__Vector_impl_data._M_start = ppRVar7;
  *(pointer *)
   ((long)&(pRVar14->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
           super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>._successors.
           super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
           super__Vector_impl_data + 8) = ppRVar8;
  *(pointer *)&node->super_SubgraphNode<dg::dda::RWNode> = ppRVar9;
  (node->super_SubgraphNode<dg::dda::RWNode>).data = ppRVar10;
  (node->super_SubgraphNode<dg::dda::RWNode>).user_data = ppRVar6;
  if (s_00 == (RWBBlock *)0x0) {
LAB_0010edf9:
    ElemWithEdges<dg::dda::RWBBlock>::addSuccessor(this_01,s);
    in_RDX._M_head_impl = extraout_RDX_00;
  }
  else {
    ElemWithEdges<dg::dda::RWBBlock>::addSuccessor(this_01,s_00);
    in_RDX = extraout_RDX.super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl;
    if (s != (RWBBlock *)0x0) {
      this_01 = &(s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                 super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>;
      goto LAB_0010edf9;
    }
  }
  *(RWBBlock **)
   &(this->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>
       = s_00;
  (this->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>.
  super_ElemWithEdges<dg::dda::RWBBlock>._successors.
  super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)s;
LAB_0010ee0a:
  pVar19.second._M_t.
  super___uniq_ptr_impl<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>._M_t.
  super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>.
  super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl =
       (__uniq_ptr_data<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>,_true,_true>)
       (__uniq_ptr_data<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>,_true,_true>)
       in_RDX._M_head_impl;
  pVar19.first._M_t.
  super___uniq_ptr_impl<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>._M_t.
  super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>.
  super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl =
       (__uniq_ptr_data<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>,_true,_true>)
       (__uniq_ptr_data<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>,_true,_true>)this;
  return pVar19;
}

Assistant:

std::pair<std::unique_ptr<RWBBlock>, std::unique_ptr<RWBBlock>>
    splitAround(NodeT *node) {
        assert(node->getBBlock() == this && "Spliting a block on invalid node");

        RWBBlock *withnode = nullptr;
        RWBBlock *after = nullptr;

        if (getNodes().size() == 1) {
            assert(*getNodes().begin() == node);
            return {nullptr, nullptr};
        }

#ifndef NDEBUG
        auto old_size = getNodes().size();
        assert(old_size > 1);
#endif
        unsigned num = 0;
        auto it = getNodes().begin(), et = getNodes().end();
        for (; it != et; ++it) {
            if (*it == node) {
                break;
            }
            ++num;
        }

        assert(it != et && "Did not find the node");
        assert(*it == node);

        ++it;
        if (it != et) {
            after = new RWBBlock(subgraph);
            for (; it != et; ++it) {
                after->append(*it);
            }
        }

        // truncate nodes in this block
        if (num > 0) {
            withnode = new RWBBlock(subgraph);
            withnode->append(node);

            getNodes().resize(num);
        } else {
            assert(*getNodes().begin() == node);
            assert(after && "Should have a suffix");
            getNodes().resize(1);
        }

        assert(!withnode || withnode->size() == 1);
        assert(((getNodes().size() + (withnode ? withnode->size() : 0) +
                 (after ? after->size() : 0)) == old_size) &&
               "Bug in splitting nodes");

        // reconnect edges
        RWBBlock *bbwithsuccessors = after;
        if (!bbwithsuccessors) // no suffix
            bbwithsuccessors = withnode;

        assert(bbwithsuccessors);
        for (auto *s : this->_successors) {
            for (auto &p : s->_predecessors) {
                if (p == this) {
                    p = bbwithsuccessors;
                }
            }
        }
        // swap this and after successors
        bbwithsuccessors->_successors.swap(this->_successors);

        if (withnode) {
            this->addSuccessor(withnode);
            if (after) {
                withnode->addSuccessor(after);
            }
        } else {
            assert(after && "Should have a suffix");
            this->addSuccessor(after);
        }

        return {std::unique_ptr<RWBBlock>(withnode),
                std::unique_ptr<RWBBlock>(after)};
    }